

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O1

void __thiscall ipx::Basis::PivotFreeVariablesIntoBasis(Basis *this,double *colweights,Info *info)

{
  iterator __position;
  ipxint *piVar1;
  int iVar2;
  int iVar3;
  Model *pMVar4;
  bool bVar5;
  Int IVar6;
  ostream *poVar7;
  int iVar8;
  ulong uVar9;
  Int ii;
  string *in_R8;
  long lVar10;
  int iVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  vector<int,_std::allocator<int>_> remaining;
  bool exchanged;
  IndexedVector ftran;
  stringstream h_logging_stream;
  char local_249;
  int *local_248;
  iterator iStack_240;
  int *local_238;
  ulong local_228;
  double local_220;
  string local_218;
  IndexedVector local_1f8;
  double local_1c8;
  undefined8 uStack_1c0;
  undefined1 local_1b8 [24];
  string local_1a0 [104];
  ios_base local_138 [264];
  
  IVar6 = this->model_->num_rows_;
  iVar2 = this->model_->num_cols_;
  IndexedVector::IndexedVector(&local_1f8,IVar6);
  local_220 = (this->control_->parameters_).super_ipx_parameters.dependency_tol;
  (info->super_ipx_info).errflag = 0;
  (info->super_ipx_info).dependent_cols = 0;
  local_248 = (int *)0x0;
  iStack_240._M_current = (int *)0x0;
  local_238 = (int *)0x0;
  local_1b8._0_4_ = 0;
  iVar11 = iVar2 + IVar6;
  if (iVar11 != 0 && SCARRY4(iVar2,IVar6) == iVar11 < 0) {
    do {
      if ((ABS(colweights[(int)local_1b8._0_4_]) == INFINITY) &&
         ((this->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[(int)local_1b8._0_4_] < 0)) {
        if (iStack_240._M_current == local_238) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_248,iStack_240,(int *)local_1b8);
        }
        else {
          *iStack_240._M_current = local_1b8._0_4_;
          iStack_240._M_current = iStack_240._M_current + 1;
        }
      }
      local_1b8._0_4_ = local_1b8._0_4_ + 1;
    } while ((int)local_1b8._0_4_ < iVar11);
  }
  poVar7 = Control::Debug(this->control_,1);
  Textline<char[35]>((string *)local_1b8,(char (*) [35])"Number of free variables nonbasic:");
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(char *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_),local_1b8._8_8_);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  local_218._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_218,1);
  if ((undefined1 *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_) != local_1b8 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_));
  }
  Control::ResetPrintInterval(this->control_);
  if (local_248 == iStack_240._M_current) {
    local_228 = 0;
  }
  else {
    if (local_220 <= 0.0) {
      local_220 = 0.0;
    }
    local_228 = 0;
    do {
      iVar2 = iStack_240._M_current[-1];
      IVar6 = Control::InterruptCheck(this->control_,-1);
      (info->super_ipx_info).errflag = IVar6;
      iVar11 = 1;
      if (IVar6 == 0) {
        SolveForUpdate(this,iVar2,&local_1f8);
        bVar5 = IndexedVector::sparse(&local_1f8);
        if (bVar5) {
          if ((long)local_1f8.nnz_ < 1) {
LAB_00395733:
            iVar11 = -1;
            dVar13 = 0.0;
            dVar14 = 0.0;
            iVar8 = -1;
          }
          else {
            in_R8 = (string *)
                    (this->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
            iVar11 = -1;
            iVar8 = -1;
            lVar10 = 0;
            dVar15 = 0.0;
            dVar16 = 0.0;
            do {
              iVar3 = local_1f8.pattern_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar10];
              dVar12 = ABS(local_1f8.elements_._M_data[iVar3]);
              if (dVar15 < dVar12) {
                iVar11 = iVar3;
              }
              dVar14 = dVar12;
              if (ABS(colweights[*(int *)((long)&(in_R8->_M_dataplus)._M_p + (long)iVar3 * 4)]) ==
                  INFINITY || dVar12 <= dVar16) {
                dVar14 = dVar16;
              }
              dVar13 = dVar12;
              if (dVar12 <= dVar15) {
                dVar13 = dVar15;
              }
              if (ABS(colweights[*(int *)((long)&(in_R8->_M_dataplus)._M_p + (long)iVar3 * 4)]) !=
                  INFINITY && dVar12 > dVar16) {
                iVar8 = iVar3;
              }
              lVar10 = lVar10 + 1;
              dVar15 = dVar13;
              dVar16 = dVar14;
            } while (local_1f8.nnz_ != lVar10);
          }
        }
        else {
          if ((int)(uint)local_1f8.elements_._M_size < 1) goto LAB_00395733;
          iVar11 = -1;
          uVar9 = 0xffffffff;
          in_R8 = (string *)0x0;
          dVar15 = 0.0;
          dVar16 = 0.0;
          do {
            dVar12 = ABS(local_1f8.elements_._M_data[(long)in_R8]);
            if (dVar15 < dVar12) {
              iVar11 = (int)in_R8;
            }
            dVar14 = dVar12;
            if (ABS(colweights
                    [(this->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)in_R8]]) == INFINITY || dVar12 <= dVar16
               ) {
              dVar14 = dVar16;
            }
            dVar13 = dVar12;
            if (dVar12 <= dVar15) {
              dVar13 = dVar15;
            }
            if (ABS(colweights
                    [(this->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)in_R8]]) != INFINITY && dVar12 > dVar16)
            {
              uVar9 = (ulong)in_R8 & 0xffffffff;
            }
            iVar8 = (int)uVar9;
            in_R8 = (string *)((long)&(in_R8->_M_dataplus)._M_p + 1);
            dVar15 = dVar13;
            dVar16 = dVar14;
          } while ((string *)(ulong)((uint)local_1f8.elements_._M_size & 0x7fffffff) != in_R8);
        }
        if ((dVar13 <= 4.0) || (1.0 <= dVar14)) {
          if (local_220 < dVar14) {
            in_R8 = (string *)local_1b8;
            IVar6 = ExchangeIfStable(this,(this->basis_).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start[iVar8],iVar2,
                                     local_1f8.elements_._M_data[iVar8],-1,(bool *)in_R8);
            (info->super_ipx_info).errflag = IVar6;
            if (IVar6 == 0) {
              if (local_1b8[0] != (stringstream)0x1) goto LAB_003958d7;
              iStack_240._M_current = iStack_240._M_current + -1;
              piVar1 = &(info->super_ipx_info).updates_start;
              *piVar1 = *piVar1 + 1;
              goto LAB_00395b39;
            }
            goto LAB_00395810;
          }
          if ((info->super_ipx_info).cols_inconsistent == 0) {
            pMVar4 = this->model_;
            local_1c8 = (pMVar4->c_)._M_data[iVar2];
            uStack_1c0 = 0;
            bVar5 = IndexedVector::sparse(&local_1f8);
            dVar15 = local_1c8;
            if (bVar5) {
              if (0 < (long)local_1f8.nnz_) {
                lVar10 = 0;
                do {
                  in_R8 = (string *)
                          (long)local_1f8.pattern_.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start[lVar10];
                  iVar2 = (this->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[(long)in_R8];
                  if (ABS(colweights[iVar2]) == INFINITY) {
                    dVar15 = dVar15 - (pMVar4->c_)._M_data[iVar2] *
                                      local_1f8.elements_._M_data[(long)in_R8];
                  }
                  lVar10 = lVar10 + 1;
                } while (local_1f8.nnz_ != lVar10);
              }
            }
            else if (0 < (int)(uint)local_1f8.elements_._M_size) {
              uVar9 = 0;
              do {
                iVar2 = (this->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar9];
                in_R8 = (string *)((ulong)colweights[iVar2] & 0x7fffffffffffffff);
                if (in_R8 == (string *)&DAT_7ff0000000000000) {
                  in_R8 = (string *)(pMVar4->c_)._M_data;
                  dVar15 = dVar15 - (double)(&in_R8->_M_dataplus)[iVar2]._M_p *
                                    local_1f8.elements_._M_data[uVar9];
                }
                uVar9 = uVar9 + 1;
              } while (((uint)local_1f8.elements_._M_size & 0x7fffffff) != uVar9);
            }
            if (local_220 < ABS(dVar15)) {
              local_1c8 = dVar15;
              poVar7 = Control::Debug(this->control_,1);
              Textline<char[44]>((string *)local_1b8,
                                 (char (*) [44])"Unbounded primal ray with objective change:");
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,(char *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_),
                                  local_1b8._8_8_);
              Format_abi_cxx11_(&local_218,(ipx *)0x0,local_1c8,2,0x100,(fmtflags)in_R8);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,local_218._M_dataplus._M_p,local_218._M_string_length);
              local_249 = '\n';
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_249,1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._M_dataplus._M_p != &local_218.field_2) {
                operator_delete(local_218._M_dataplus._M_p);
              }
              if ((undefined1 *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_) != local_1b8 + 0x10) {
                operator_delete((undefined1 *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_));
              }
              (info->super_ipx_info).cols_inconsistent = 1;
            }
          }
          piVar1 = &(info->super_ipx_info).dependent_cols;
          *piVar1 = *piVar1 + 1;
          iStack_240._M_current = iStack_240._M_current + -1;
        }
        else {
          local_1b8._0_4_ =
               (this->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[iVar11];
          in_R8 = &local_218;
          IVar6 = ExchangeIfStable(this,local_1b8._0_4_,iVar2,local_1f8.elements_._M_data[iVar11],-1
                                   ,(bool *)in_R8);
          (info->super_ipx_info).errflag = IVar6;
          if (IVar6 == 0) {
            if ((char)local_218._M_dataplus._M_p != '\x01') {
LAB_003958d7:
              iVar11 = 5;
              goto LAB_003958dc;
            }
            __position._M_current = iStack_240._M_current + -1;
            if (__position._M_current == local_238) {
              iStack_240._M_current = __position._M_current;
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_248,__position,(int *)local_1b8);
            }
            else {
              iStack_240._M_current[-1] = local_1b8._0_4_;
            }
            piVar1 = &(info->super_ipx_info).updates_start;
            *piVar1 = *piVar1 + 1;
            local_228 = (ulong)((int)local_228 + 1);
LAB_00395b39:
            iVar11 = 0;
            bVar5 = true;
          }
          else {
LAB_00395810:
            iVar11 = 1;
LAB_003958dc:
            bVar5 = false;
          }
          if (!bVar5) goto LAB_00395af4;
        }
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        local_218._M_string_length = 0;
        local_218.field_2._M_local_buf[0] = '\0';
        local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
        std::__cxx11::stringbuf::str(local_1a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b8 + 0x10)," ",1);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)(local_1b8 + 0x10));
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7," free variables remaining\n",0x1a);
        Control::hIntervalLog(this->control_,(stringstream *)local_1b8);
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base(local_138);
        iVar11 = 0;
      }
LAB_00395af4:
      if ((iVar11 != 5) && (iVar11 != 0)) goto LAB_00395bc5;
    } while (local_248 != iStack_240._M_current);
  }
  poVar7 = Control::Debug(this->control_,1);
  Textline<char[48]>((string *)local_1b8,
                     (char (*) [48])"Number of free variables swapped for stability:");
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(char *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_),local_1b8._8_8_);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)local_228);
  local_218._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_218,1);
  if ((undefined1 *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_) != local_1b8 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_));
  }
LAB_00395bc5:
  if (local_248 != (int *)0x0) {
    operator_delete(local_248);
  }
  if (local_1f8.pattern_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.pattern_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  operator_delete(local_1f8.elements_._M_data);
  return;
}

Assistant:

void Basis::PivotFreeVariablesIntoBasis(const double* colweights, Info* info) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    IndexedVector ftran(m);
    const double dependency_tol = std::max(0.0, control_.dependency_tol());
    info->errflag = 0;
    info->dependent_cols = 0;
    Int stability_pivots = 0;

    // Maintain stack of free nonbasic variables.
    std::vector<Int> remaining;
    for (Int j = 0; j < n+m; j++) {
        if (std::isinf(colweights[j]) && map2basis_[j] < 0)
            remaining.push_back(j);
    }
    control_.Debug() << Textline("Number of free variables nonbasic:")
                  << remaining.size() << '\n';

    control_.ResetPrintInterval();
    while (!remaining.empty()) {
        Int jn = remaining.back();
        assert(std::isinf(colweights[jn]));
        assert(map2basis_[jn] < 0);
        if ((info->errflag = control_.InterruptCheck()) != 0)
            return;

        SolveForUpdate(jn, ftran);
        Int pmax = -1;
        Int pmax_nonfree = -1;
        double fmax = 0.0;
        double fmax_nonfree = 0.0;
        auto update_max = [&](Int p, double f) {
            f = std::abs(f);
            if (f > fmax) {
                fmax = f;
                pmax = p;
            }
            if (!std::isinf(colweights[basis_[p]])) {
                if (f > fmax_nonfree) {
                    fmax_nonfree = f;
                    pmax_nonfree = p;
                }
            }
        };
        for_each_nonzero(ftran, update_max);

        if (fmax > 4.0 && fmax_nonfree < 1.0) {
            Int jb = basis_[pmax];
            assert(std::isinf(colweights[jb]));
            bool exchanged;
            info->errflag = ExchangeIfStable(jb, jn, ftran[pmax], -1,
                                             &exchanged);
            if (info->errflag)
                return;
            if (!exchanged)     // factorization was unstable, try again
                continue;
            remaining.pop_back();
            remaining.push_back(jb);
            info->updates_start++;
            stability_pivots++;
        } else {
            if (fmax_nonfree <= dependency_tol) {
                // jn cannot be pivoted into the basis. If we do not have an
                // unbounded primal ray yet, then test if column jn yields one.
                // Compute the change in the primal objective that is caused by
                // a unit increase of x[jn] with corresponding adjustment of
                // free basic variables.
                if (!info->cols_inconsistent) {
                    const Vector& c = model_.c();
                    double delta_obj = c[jn];
                    auto update_delta_obj = [&](Int p, double f) {
                        Int j = basis_[p];
                        if (std::isinf(colweights[j]))
                            delta_obj -= c[j] * f;
                    };
                    for_each_nonzero(ftran, update_delta_obj);
                    if (std::abs(delta_obj) > dependency_tol) {
                        control_.Debug()
                            << Textline(
                                "Unbounded primal ray with objective change:")
                            << sci2(delta_obj) << '\n';
                        info->cols_inconsistent = true;
                    }
                }
                info->dependent_cols++;
                remaining.pop_back();
            } else {
                Int jb = basis_[pmax_nonfree];
                bool exchanged;
                info->errflag = ExchangeIfStable(jb, jn, ftran[pmax_nonfree],
                                                 -1, &exchanged);
                if (info->errflag)
                    return;
                if (!exchanged)     // factorization was unstable, try again
                    continue;
                remaining.pop_back();
                info->updates_start++;
            }
        }
	std::stringstream h_logging_stream;
	h_logging_stream.str(std::string());
	h_logging_stream << " " << remaining.size() << " free variables remaining\n";
	control_.hIntervalLog(h_logging_stream);
    }
    control_.Debug()
        << Textline("Number of free variables swapped for stability:")
        << stability_pivots << '\n';
}